

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlSearchNs(xmlDocPtr doc,xmlNodePtr node,xmlChar *nameSpace)

{
  _xmlNode **pp_Var1;
  xmlElementType xVar2;
  int iVar3;
  xmlNsPtr pxVar4;
  xmlChar *pxVar5;
  _xmlNode *p_Var6;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) {
LAB_00185992:
    pxVar4 = (xmlNsPtr)0x0;
  }
  else {
    p_Var6 = node;
    if ((nameSpace == (xmlChar *)0x0) || (iVar3 = xmlStrEqual(nameSpace,"xml"), iVar3 == 0)) {
      do {
        xVar2 = p_Var6->type;
        if (xVar2 == XML_ELEMENT_NODE) {
          for (pxVar4 = p_Var6->nsDef; pxVar4 != (xmlNsPtr)0x0; pxVar4 = pxVar4->next) {
            pxVar5 = pxVar4->prefix;
            if ((nameSpace == (xmlChar *)0x0 && pxVar5 == (xmlChar *)0x0) &&
               (pxVar4->href != (xmlChar *)0x0)) {
              return pxVar4;
            }
            if ((((nameSpace != (xmlChar *)0x0) && (pxVar5 != (xmlChar *)0x0)) &&
                (pxVar4->href != (xmlChar *)0x0)) &&
               (iVar3 = xmlStrEqual(pxVar5,nameSpace), iVar3 != 0)) {
              return pxVar4;
            }
          }
          if ((p_Var6 != node) && (pxVar4 = p_Var6->ns, pxVar4 != (xmlNsPtr)0x0)) {
            pxVar5 = pxVar4->prefix;
            if ((nameSpace == (xmlChar *)0x0 && pxVar5 == (xmlChar *)0x0) &&
               (pxVar4->href != (xmlChar *)0x0)) {
              return pxVar4;
            }
            if (((nameSpace != (xmlChar *)0x0) && (pxVar5 != (xmlChar *)0x0)) &&
               ((pxVar4->href != (xmlChar *)0x0 &&
                (iVar3 = xmlStrEqual(pxVar5,nameSpace), iVar3 != 0)))) {
              return pxVar4;
            }
          }
        }
        else {
          if (xVar2 - XML_ENTITY_REF_NODE < 2) goto LAB_00185992;
          if (xVar2 == XML_ENTITY_DECL) {
            return (xmlNsPtr)0x0;
          }
        }
        pp_Var1 = &p_Var6->parent;
        p_Var6 = *pp_Var1;
        if (*pp_Var1 == (_xmlNode *)0x0) {
          return (xmlNsPtr)0x0;
        }
      } while( true );
    }
    if (doc == (xmlDocPtr)0x0) {
      if (node->type == XML_ELEMENT_NODE) {
        pxVar4 = (xmlNsPtr)(*xmlMalloc)(0x30);
        if (pxVar4 != (xmlNsPtr)0x0) {
          pxVar4->next = (_xmlNs *)0x0;
          *(undefined8 *)&pxVar4->type = 0;
          pxVar4->_private = (void *)0x0;
          pxVar4->context = (_xmlDoc *)0x0;
          pxVar4->href = (xmlChar *)0x0;
          pxVar4->prefix = (xmlChar *)0x0;
          pxVar4->type = XML_NAMESPACE_DECL;
          pxVar5 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
          pxVar4->href = pxVar5;
          pxVar5 = xmlStrdup("xml");
          pxVar4->prefix = pxVar5;
          pxVar4->next = node->nsDef;
          node->nsDef = pxVar4;
          return pxVar4;
        }
        __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"searching namespace");
        return (xmlNsPtr)0x0;
      }
      doc = node->doc;
      if (doc == (_xmlDoc *)0x0) goto LAB_00185992;
    }
    pxVar4 = doc->oldNs;
    if (pxVar4 == (xmlNsPtr)0x0) {
      pxVar4 = xmlTreeEnsureXMLDecl(doc);
      return pxVar4;
    }
  }
  return pxVar4;
}

Assistant:

xmlNsPtr
xmlSearchNs(xmlDocPtr doc, xmlNodePtr node, const xmlChar *nameSpace) {

    xmlNsPtr cur;
    const xmlNode *orig = node;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL)) return(NULL);
    if ((nameSpace != NULL) &&
	(xmlStrEqual(nameSpace, (const xmlChar *)"xml"))) {
	if ((doc == NULL) && (node->type == XML_ELEMENT_NODE)) {
	    /*
	     * The XML-1.0 namespace is normally held on the root
	     * element. In this case exceptionally create it on the
	     * node element.
	     */
	    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
	    if (cur == NULL) {
		xmlTreeErrMemory("searching namespace");
		return(NULL);
	    }
	    memset(cur, 0, sizeof(xmlNs));
	    cur->type = XML_LOCAL_NAMESPACE;
	    cur->href = xmlStrdup(XML_XML_NAMESPACE);
	    cur->prefix = xmlStrdup((const xmlChar *)"xml");
	    cur->next = node->nsDef;
	    node->nsDef = cur;
	    return(cur);
	}
	if (doc == NULL) {
	    doc = node->doc;
	    if (doc == NULL)
		return(NULL);
	}
	/*
	* Return the XML namespace declaration held by the doc.
	*/
	if (doc->oldNs == NULL)
	    return(xmlTreeEnsureXMLDecl(doc));
	else
	    return(doc->oldNs);
    }
    while (node != NULL) {
	if ((node->type == XML_ENTITY_REF_NODE) ||
	    (node->type == XML_ENTITY_NODE) ||
	    (node->type == XML_ENTITY_DECL))
	    return(NULL);
	if (node->type == XML_ELEMENT_NODE) {
	    cur = node->nsDef;
	    while (cur != NULL) {
		if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		    (cur->href != NULL))
		    return(cur);
		if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		    (cur->href != NULL) &&
		    (xmlStrEqual(cur->prefix, nameSpace)))
		    return(cur);
		cur = cur->next;
	    }
	    if (orig != node) {
	        cur = node->ns;
	        if (cur != NULL) {
		    if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		        (cur->href != NULL))
		        return(cur);
		    if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		        (cur->href != NULL) &&
		        (xmlStrEqual(cur->prefix, nameSpace)))
		        return(cur);
	        }
	    }
	}
	node = node->parent;
    }
    return(NULL);
}